

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O2

ErrorCode PDB::HasValidDBIStream(RawFile *file)

{
  ErrorCode EVar1;
  ErrorCode EVar2;
  DirectMSFStream stream;
  StreamHeader header;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>(&stream,file,3);
  EVar2 = InvalidStream;
  if (0x3f < stream.m_size) {
    DirectMSFStream::ReadAtOffset<PDB::DBI::StreamHeader>(&header,&stream,0);
    EVar1 = UnknownVersion;
    if (header.version == V70) {
      EVar1 = Success;
    }
    EVar2 = InvalidSignature;
    if (header.signature == 0xffffffff) {
      EVar2 = EVar1;
    }
  }
  return EVar2;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidDBIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(DBIStreamIndex);
	if (stream.GetSize() < sizeof(DBI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const DBI::StreamHeader header = stream.ReadAtOffset<DBI::StreamHeader>(0u);
	if (header.signature != DBI::StreamHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (header.version != DBI::StreamHeader::Version::V70)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}